

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

void arkFree(void **arkode_mem)

{
  ARKodeMem ark_mem;
  
  ark_mem = (ARKodeMem)*arkode_mem;
  if (ark_mem != (ARKodeMem)0x0) {
    arkFreeVectors(ark_mem);
    if (ark_mem->hadapt_mem != (ARKodeHAdaptMem)0x0) {
      free(ark_mem->hadapt_mem);
      ark_mem->hadapt_mem = (ARKodeHAdaptMem)0x0;
    }
    if (ark_mem->interp != (ARKInterp)0x0) {
      arkInterpFree(ark_mem,ark_mem->interp);
      ark_mem->interp = (ARKInterp)0x0;
    }
    if (ark_mem->root_mem != (ARKodeRootMem)0x0) {
      arkRootFree(*arkode_mem);
      ark_mem->root_mem = (ARKodeRootMem)0x0;
    }
    free(*arkode_mem);
    *arkode_mem = (void *)0x0;
  }
  return;
}

Assistant:

void arkFree(void **arkode_mem)
{
  ARKodeMem ark_mem;

  if (*arkode_mem == NULL) return;

  ark_mem = (ARKodeMem) (*arkode_mem);

  /* free vector storage */
  arkFreeVectors(ark_mem);

  /* free the time step adaptivity module */
  if (ark_mem->hadapt_mem != NULL) {
    free(ark_mem->hadapt_mem);
    ark_mem->hadapt_mem = NULL;
  }

  /* free the interpolation module */
  if (ark_mem->interp != NULL) {
    arkInterpFree(ark_mem, ark_mem->interp);
    ark_mem->interp = NULL;
  }

  /* free the root-finding module */
  if (ark_mem->root_mem != NULL) {
    (void) arkRootFree(*arkode_mem);
    ark_mem->root_mem = NULL;
  }

  free(*arkode_mem);
  *arkode_mem = NULL;
}